

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

idx_t duckdb::FindRangeBound<duckdb::LessThan,false>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  PhysicalType PVar1;
  byte bVar2;
  data_t dVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [12];
  byte bVar11;
  char cVar12;
  bool bVar13;
  short sVar14;
  unsigned_short uVar15;
  uint uVar16;
  int iVar17;
  int64_t ldays;
  reference pvVar18;
  OutOfRangeException *pOVar19;
  unsigned_long uVar20;
  InternalException *this;
  ulong uVar21;
  ulong uVar22;
  idx_t iVar23;
  long lVar24;
  long lVar25;
  int64_t lmicros;
  long lVar26;
  long lVar27;
  long lVar28;
  float fVar29;
  hugeint_t hVar30;
  interval_t iVar31;
  WindowColumnIterator<unsigned_long> WVar32;
  WindowColumnIterator<short> WVar33;
  WindowColumnIterator<unsigned_int> WVar34;
  WindowColumnIterator<signed_char> WVar35;
  WindowColumnIterator<unsigned_short> WVar36;
  WindowColumnIterator<unsigned_char> WVar37;
  WindowColumnIterator<int> WVar38;
  WindowColumnIterator<double> WVar39;
  WindowColumnIterator<long> WVar40;
  WindowColumnIterator<float> WVar41;
  WindowColumnIterator<duckdb::uhugeint_t> WVar42;
  WindowColumnIterator<duckdb::hugeint_t> WVar43;
  WindowColumnIterator<duckdb::interval_t> WVar44;
  WindowColumnIterator<unsigned_long> __last;
  WindowColumnIterator<short> __last_00;
  WindowColumnIterator<unsigned_int> __last_01;
  WindowColumnIterator<signed_char> __last_02;
  WindowColumnIterator<unsigned_short> __last_03;
  WindowColumnIterator<unsigned_char> __last_04;
  WindowColumnIterator<int> __last_05;
  WindowColumnIterator<double> __last_06;
  WindowColumnIterator<long> __last_07;
  WindowColumnIterator<float> __last_08;
  WindowColumnIterator<duckdb::uhugeint_t> __last_09;
  WindowColumnIterator<duckdb::hugeint_t> __last_10;
  WindowColumnIterator<duckdb::interval_t> __last_11;
  OperationCompare<unsigned_char,_duckdb::LessThan> comp;
  uchar val;
  double cur_val;
  _Any_data local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  idx_t local_90;
  _Any_data local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  interval_t local_68;
  long local_50;
  long local_48;
  uhugeint_t local_40;
  
  auVar10 = (undefined1  [12])local_40._4_12_;
  PVar1 = boundary->ptype;
  local_90 = order_end;
  switch(PVar1) {
  case UINT8:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    bVar2 = pvVar18->data[chunk_idx];
    local_68.months._0_1_ = bVar2;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      bVar11 = WindowCursor::GetCell<unsigned_char>(range_hi,0,local_90 - 1);
      if (bVar11 < bVar2) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar11 = WindowCursor::GetCell<unsigned_char>(range_lo,0,order_begin);
      iVar23 = local_90;
      if (bVar2 < bVar11) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<unsigned_char>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if (uVar21 < iVar23 && order_begin < uVar21) {
        bVar11 = WindowCursor::GetCell<unsigned_char>(range_hi,0,uVar21 - 1);
        if (bVar2 <= bVar11) {
          iVar23 = prev->end;
          if (bVar11 <= bVar2) goto LAB_017a3597;
          iVar23 = iVar23 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_char,_unsigned_char)>::function
              ((function<bool_(unsigned_char,_unsigned_char)> *)&local_b0,
               (function<bool_(unsigned_char,_unsigned_char)> *)&local_88);
    WVar37.pos = order_begin;
    WVar37.coll = range_lo;
    __last_04.pos = iVar23;
    __last_04.coll = range_hi;
    WVar37 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_char>,unsigned_char,duckdb::OperationCompare<unsigned_char,duckdb::LessThan>>
                       (WVar37,__last_04,(uchar *)&local_68,
                        (OperationCompare<unsigned_char,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar37.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a3597:
    if ((code *)local_78._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    }
    return iVar23;
  case INT8:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    dVar3 = pvVar18->data[chunk_idx];
    local_68.months._0_1_ = dVar3;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      cVar12 = WindowCursor::GetCell<signed_char>(range_hi,0,local_90 - 1);
      if (cVar12 < (char)dVar3) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cVar12 = WindowCursor::GetCell<signed_char>(range_lo,0,order_begin);
      iVar23 = local_90;
      if ((char)dVar3 < cVar12) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<signed_char>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if ((uVar21 < iVar23 && order_begin < uVar21) &&
         (cVar12 = WindowCursor::GetCell<signed_char>(range_hi,0,uVar21 - 1), (char)dVar3 <= cVar12)
         ) {
        iVar23 = prev->end;
        if (cVar12 <= (char)dVar3) goto LAB_017a318d;
        iVar23 = iVar23 + 1;
      }
    }
    ::std::function<bool_(signed_char,_signed_char)>::function
              ((function<bool_(signed_char,_signed_char)> *)&local_b0,
               (function<bool_(signed_char,_signed_char)> *)&local_88);
    WVar35.pos = order_begin;
    WVar35.coll = range_lo;
    __last_02.pos = iVar23;
    __last_02.coll = range_hi;
    WVar35 = ::std::
             upper_bound<duckdb::WindowColumnIterator<signed_char>,signed_char,duckdb::OperationCompare<signed_char,duckdb::LessThan>>
                       (WVar35,__last_02,(char *)&local_68,
                        (OperationCompare<signed_char,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar35.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a318d:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  case UINT16:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar5 = *(ushort *)(pvVar18->data + chunk_idx * 2);
    local_68.months._0_2_ = uVar5;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar15 = WindowCursor::GetCell<unsigned_short>(range_hi,0,local_90 - 1);
      if (uVar15 < uVar5) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar15 = WindowCursor::GetCell<unsigned_short>(range_lo,0,order_begin);
      iVar23 = local_90;
      if (uVar5 < uVar15) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<unsigned_short>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if (uVar21 < iVar23 && order_begin < uVar21) {
        uVar15 = WindowCursor::GetCell<unsigned_short>(range_hi,0,uVar21 - 1);
        if (uVar5 <= uVar15) {
          iVar23 = prev->end;
          if (uVar15 <= uVar5) goto LAB_017a34b1;
          iVar23 = iVar23 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_short,_unsigned_short)>::function
              ((function<bool_(unsigned_short,_unsigned_short)> *)&local_b0,
               (function<bool_(unsigned_short,_unsigned_short)> *)&local_88);
    WVar36.pos = order_begin;
    WVar36.coll = range_lo;
    __last_03.pos = iVar23;
    __last_03.coll = range_hi;
    WVar36 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_short>,unsigned_short,duckdb::OperationCompare<unsigned_short,duckdb::LessThan>>
                       (WVar36,__last_03,(unsigned_short *)&local_68,
                        (OperationCompare<unsigned_short,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar36.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a34b1:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  case INT16:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    sVar4 = *(short *)(pvVar18->data + chunk_idx * 2);
    local_68.months._0_2_ = sVar4;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      sVar14 = WindowCursor::GetCell<short>(range_hi,0,local_90 - 1);
      if (sVar14 < sVar4) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      sVar14 = WindowCursor::GetCell<short>(range_lo,0,order_begin);
      iVar23 = local_90;
      if (sVar4 < sVar14) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<short>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if ((uVar21 < iVar23 && order_begin < uVar21) &&
         (sVar14 = WindowCursor::GetCell<short>(range_hi,0,uVar21 - 1), sVar4 <= sVar14)) {
        iVar23 = prev->end;
        if (sVar14 <= sVar4) goto LAB_017a2fc1;
        iVar23 = iVar23 + 1;
      }
    }
    ::std::function<bool_(short,_short)>::function
              ((function<bool_(short,_short)> *)&local_b0,(function<bool_(short,_short)> *)&local_88
              );
    WVar33.pos = order_begin;
    WVar33.coll = range_lo;
    __last_00.pos = iVar23;
    __last_00.coll = range_hi;
    WVar33 = ::std::
             upper_bound<duckdb::WindowColumnIterator<short>,short,duckdb::OperationCompare<short,duckdb::LessThan>>
                       (WVar33,__last_00,(short *)&local_68,
                        (OperationCompare<short,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar33.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a2fc1:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  case UINT32:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar6 = *(uint *)(pvVar18->data + chunk_idx * 4);
    local_68.months = uVar6;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar16 = WindowCursor::GetCell<unsigned_int>(range_hi,0,local_90 - 1);
      if (uVar16 < uVar6) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar16 = WindowCursor::GetCell<unsigned_int>(range_lo,0,order_begin);
      iVar23 = local_90;
      if (uVar6 < uVar16) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<unsigned_int>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if (uVar21 < iVar23 && order_begin < uVar21) {
        uVar16 = WindowCursor::GetCell<unsigned_int>(range_hi,0,uVar21 - 1);
        if (uVar6 <= uVar16) {
          iVar23 = prev->end;
          if (uVar16 <= uVar6) goto LAB_017a30a7;
          iVar23 = iVar23 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_int,_unsigned_int)>::function
              ((function<bool_(unsigned_int,_unsigned_int)> *)&local_b0,
               (function<bool_(unsigned_int,_unsigned_int)> *)&local_88);
    WVar34.pos = order_begin;
    WVar34.coll = range_lo;
    __last_01.pos = iVar23;
    __last_01.coll = range_hi;
    WVar34 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_int>,unsigned_int,duckdb::OperationCompare<unsigned_int,duckdb::LessThan>>
                       (WVar34,__last_01,(uint *)&local_68,
                        (OperationCompare<unsigned_int,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar34.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a30a7:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  case INT32:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    iVar7 = *(int *)(pvVar18->data + chunk_idx * 4);
    local_68.months = iVar7;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      iVar17 = WindowCursor::GetCell<int>(range_hi,0,local_90 - 1);
      if (iVar17 < iVar7) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar17 = WindowCursor::GetCell<int>(range_lo,0,order_begin);
      iVar23 = local_90;
      if (iVar7 < iVar17) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<int>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if ((uVar21 < iVar23 && order_begin < uVar21) &&
         (iVar17 = WindowCursor::GetCell<int>(range_hi,0,uVar21 - 1), iVar7 <= iVar17)) {
        iVar23 = prev->end;
        if (iVar17 <= iVar7) goto LAB_017a367d;
        iVar23 = iVar23 + 1;
      }
    }
    ::std::function<bool_(int,_int)>::function
              ((function<bool_(int,_int)> *)&local_b0,(function<bool_(int,_int)> *)&local_88);
    WVar38.pos = order_begin;
    WVar38.coll = range_lo;
    __last_05.pos = iVar23;
    __last_05.coll = range_hi;
    WVar38 = ::std::
             upper_bound<duckdb::WindowColumnIterator<int>,int,duckdb::OperationCompare<int,duckdb::LessThan>>
                       (WVar38,__last_05,&local_68.months,
                        (OperationCompare<int,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar38.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a367d:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  case UINT64:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar8 = *(ulong *)(pvVar18->data + chunk_idx * 8);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_68._0_8_ = uVar8;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar20 = WindowCursor::GetCell<unsigned_long>(range_hi,0,local_90 - 1);
      if (uVar20 < uVar8) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar20 = WindowCursor::GetCell<unsigned_long>(range_lo,0,order_begin);
      iVar23 = local_90;
      if (uVar8 < uVar20) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar21 = prev->start;
    uVar22 = prev->end;
    if (uVar21 < uVar22) {
      if (uVar21 < iVar23 && order_begin <= uVar21) {
        WindowCursor::GetCell<unsigned_long>(range_lo,0,uVar21);
        uVar22 = prev->end;
      }
      if (uVar22 < iVar23 && order_begin < uVar22) {
        uVar20 = WindowCursor::GetCell<unsigned_long>(range_hi,0,uVar22 - 1);
        if (uVar8 <= uVar20) {
          iVar23 = prev->end;
          if (uVar20 <= uVar8) goto LAB_017a2ed9;
          iVar23 = iVar23 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_b0,
               (function<bool_(unsigned_long,_unsigned_long)> *)&local_88);
    WVar32.pos = order_begin;
    WVar32.coll = range_lo;
    __last.pos = iVar23;
    __last.coll = range_hi;
    WVar32 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_long>,unsigned_long,duckdb::OperationCompare<unsigned_long,duckdb::LessThan>>
                       (WVar32,__last,(unsigned_long *)&local_68,
                        (OperationCompare<unsigned_long,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar32.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a2ed9:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  case INT64:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    lVar9 = *(long *)(pvVar18->data + chunk_idx * 8);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_68._0_8_ = lVar9;
    if (range == EXPR_PRECEDING_RANGE) {
      lVar24 = WindowCursor::GetCell<long>(range_hi,0,local_90 - 1);
      if (lVar24 < lVar9) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      lVar24 = WindowCursor::GetCell<long>(range_lo,0,order_begin);
      iVar23 = local_90;
      if (lVar9 < lVar24) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<long>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if ((uVar21 < iVar23 && order_begin < uVar21) &&
         (lVar24 = WindowCursor::GetCell<long>(range_hi,0,uVar21 - 1), lVar9 <= lVar24)) {
        iVar23 = prev->end;
        if (lVar24 <= lVar9) goto LAB_017a387d;
        iVar23 = iVar23 + 1;
      }
    }
    ::std::function<bool_(long,_long)>::function
              ((function<bool_(long,_long)> *)&local_b0,(function<bool_(long,_long)> *)&local_88);
    WVar40.pos = order_begin;
    WVar40.coll = range_lo;
    __last_07.pos = iVar23;
    __last_07.coll = range_hi;
    WVar40 = ::std::
             upper_bound<duckdb::WindowColumnIterator<long>,long,duckdb::OperationCompare<long,duckdb::LessThan>>
                       (WVar40,__last_07,(long *)&local_68,
                        (OperationCompare<long,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar40.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a387d:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_017a232d_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_88._M_unused._M_object = &local_78;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Unsupported column type for RANGE","");
    InternalException::InternalException(this,(string *)&local_88);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_40._4_12_ = auVar10;
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_68.months = *(int32_t *)(pvVar18->data + chunk_idx * 4);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(range_hi,0,local_90 - 1);
      bVar13 = GreaterThan::Operation<float>((float *)&local_68,(float *)&local_40);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(range_lo,0,order_begin);
      iVar23 = local_90;
      bVar13 = GreaterThan::Operation<float>((float *)&local_40,(float *)&local_68);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<float>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if (uVar21 < iVar23 && order_begin < uVar21) {
        fVar29 = WindowCursor::GetCell<float>(range_hi,0,uVar21 - 1);
        local_b0._0_4_ = fVar29;
        bVar13 = GreaterThan::Operation<float>((float *)&local_68,(float *)&local_b0);
        if (!bVar13) {
          bVar13 = GreaterThan::Operation<float>((float *)&local_b0,(float *)&local_68);
          iVar23 = prev->end;
          if (!bVar13) goto LAB_017a3997;
          iVar23 = iVar23 + 1;
        }
      }
    }
    ::std::function<bool_(float,_float)>::function
              ((function<bool_(float,_float)> *)&local_b0,(function<bool_(float,_float)> *)&local_88
              );
    WVar41.pos = order_begin;
    WVar41.coll = range_lo;
    __last_08.pos = iVar23;
    __last_08.coll = range_hi;
    WVar41 = ::std::
             upper_bound<duckdb::WindowColumnIterator<float>,float,duckdb::OperationCompare<float,duckdb::LessThan>>
                       (WVar41,__last_08,(float *)&local_68,
                        (OperationCompare<float,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar41.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a3997:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  case DOUBLE:
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_68._0_8_ = *(undefined8 *)(pvVar18->data + chunk_idx * 8);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(range_hi,0,local_90 - 1);
      bVar13 = GreaterThan::Operation<double>((double *)&local_68,(double *)&local_40);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(range_lo,0,order_begin);
      iVar23 = local_90;
      bVar13 = GreaterThan::Operation<double>((double *)&local_40,(double *)&local_68);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<double>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if (uVar21 < iVar23 && order_begin < uVar21) {
        local_b0._M_unused._0_8_ = (undefined8)WindowCursor::GetCell<double>(range_hi,0,uVar21 - 1);
        bVar13 = GreaterThan::Operation<double>((double *)&local_68,(double *)&local_b0);
        if (!bVar13) {
          bVar13 = GreaterThan::Operation<double>((double *)&local_b0,(double *)&local_68);
          iVar23 = prev->end;
          if (!bVar13) goto LAB_017a3797;
          iVar23 = iVar23 + 1;
        }
      }
    }
    ::std::function<bool_(double,_double)>::function
              ((function<bool_(double,_double)> *)&local_b0,
               (function<bool_(double,_double)> *)&local_88);
    WVar39.pos = order_begin;
    WVar39.coll = range_lo;
    __last_06.pos = iVar23;
    __last_06.coll = range_hi;
    WVar39 = ::std::
             upper_bound<duckdb::WindowColumnIterator<double>,double,duckdb::OperationCompare<double,duckdb::LessThan>>
                       (WVar39,__last_06,(double *)&local_68,
                        (OperationCompare<double,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar39.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a3797:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  case INTERVAL:
    break;
  default:
    if (PVar1 != UINT128) {
      if (PVar1 != INT128) goto switchD_017a232d_caseD_a;
      pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
      iVar23 = local_90;
      if (boundary->scalar != false) {
        chunk_idx = 0;
      }
      uVar8 = *(ulong *)(pvVar18->data + chunk_idx * 0x10);
      lVar9 = *(long *)(pvVar18->data + chunk_idx * 0x10 + 8);
      local_78._M_allocated_capacity = 0;
      local_78._8_8_ = 0;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_68._0_8_ = uVar8;
      local_68.micros = lVar9;
      if (range == EXPR_PRECEDING_RANGE) {
        hVar30 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,local_90 - 1);
        if ((hVar30.upper < lVar9) || (hVar30.lower < uVar8 && lVar9 == hVar30.upper)) {
          pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_b0._M_unused._M_object = &local_a0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
          OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
          __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        hVar30 = WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,order_begin);
        if ((lVar9 < hVar30.upper) ||
           (iVar23 = local_90, uVar8 < hVar30.lower && hVar30.upper == lVar9)) {
          pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_b0._M_unused._M_object = &local_a0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
          OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
          __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar21 = prev->start;
      uVar22 = prev->end;
      if (uVar21 < uVar22) {
        if (uVar21 < iVar23 && order_begin <= uVar21) {
          WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,uVar21);
          uVar22 = prev->end;
        }
        if (uVar22 < iVar23 && order_begin < uVar22) {
          hVar30 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,uVar22 - 1);
          lVar24 = hVar30.upper;
          if ((lVar9 <= lVar24) && (uVar8 <= hVar30.lower || lVar9 != lVar24)) {
            iVar23 = prev->end;
            if ((lVar24 <= lVar9) && (hVar30.lower <= uVar8 || lVar9 != lVar24)) goto LAB_017a3be9;
            iVar23 = iVar23 + 1;
          }
        }
      }
      ::std::function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)>::function
                ((function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_b0,
                 (function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_88);
      WVar43.pos = order_begin;
      WVar43.coll = range_lo;
      __last_10.pos = iVar23;
      __last_10.coll = range_hi;
      WVar43 = ::std::
               upper_bound<duckdb::WindowColumnIterator<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::OperationCompare<duckdb::hugeint_t,duckdb::LessThan>>
                         (WVar43,__last_10,(hugeint_t *)&local_68,
                          (OperationCompare<duckdb::hugeint_t,_duckdb::LessThan> *)&local_b0);
      iVar23 = WVar43.pos;
      if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
      }
LAB_017a3be9:
      if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
        return iVar23;
      }
      (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
      return iVar23;
    }
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    iVar23 = local_90;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_68._0_8_ = *(undefined8 *)(pvVar18->data + chunk_idx * 0x10);
    local_68.micros = *(int64_t *)(pvVar18->data + chunk_idx * 0x10 + 8);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,local_90 - 1);
      bVar13 = uhugeint_t::operator>((uhugeint_t *)&local_68,&local_40);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,order_begin);
      iVar23 = local_90;
      bVar13 = uhugeint_t::operator>(&local_40,(uhugeint_t *)&local_68);
      if (bVar13) {
        pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b0._M_unused._M_object = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
        __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar21 = prev->end;
    if (uVar8 < uVar21) {
      if (uVar8 < iVar23 && order_begin <= uVar8) {
        WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,uVar8);
        uVar21 = prev->end;
      }
      if (uVar21 < iVar23 && order_begin < uVar21) {
        local_b0 = (_Any_data)WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,uVar21 - 1);
        bVar13 = uhugeint_t::operator>((uhugeint_t *)&local_68,(uhugeint_t *)&local_b0);
        if (!bVar13) {
          bVar13 = uhugeint_t::operator>((uhugeint_t *)&local_b0,(uhugeint_t *)&local_68);
          iVar23 = prev->end;
          if (!bVar13) goto LAB_017a3ab7;
          iVar23 = iVar23 + 1;
        }
      }
    }
    ::std::function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)>::function
              ((function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_b0,
               (function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_88);
    WVar42.pos = order_begin;
    WVar42.coll = range_lo;
    __last_09.pos = iVar23;
    __last_09.coll = range_hi;
    WVar42 = ::std::
             upper_bound<duckdb::WindowColumnIterator<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::OperationCompare<duckdb::uhugeint_t,duckdb::LessThan>>
                       (WVar42,__last_09,(uhugeint_t *)&local_68,
                        (OperationCompare<duckdb::uhugeint_t,_duckdb::LessThan> *)&local_b0);
    iVar23 = WVar42.pos;
    if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
    }
LAB_017a3ab7:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar23;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar23;
  }
  local_50 = -86400000000;
  pvVar18 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
  iVar23 = local_90;
  if (boundary->scalar != false) {
    chunk_idx = 0;
  }
  local_68._0_8_ = *(undefined8 *)(pvVar18->data + chunk_idx * 0x10);
  lVar9 = *(long *)(pvVar18->data + chunk_idx * 0x10 + 8);
  local_78._M_allocated_capacity = 0;
  local_78._8_8_ = 0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_68.micros = lVar9;
  local_48 = local_68._0_8_;
  if (range == EXPR_PRECEDING_RANGE) {
    iVar31 = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,local_90 - 1);
    lVar24 = (local_48 >> 0x20) + lVar9 / 86400000000;
    lVar26 = lVar24 % 0x1e;
    lVar27 = (long)(int)local_48 + lVar24 / 0x1e;
    lVar25 = (iVar31._0_8_ >> 0x20) + iVar31.micros / 86400000000;
    lVar24 = lVar25 % 0x1e;
    lVar25 = (long)iVar31.months + lVar25 / 0x1e;
    if ((lVar25 < lVar27) ||
       ((lVar25 <= lVar27 &&
        ((lVar24 < lVar26 ||
         ((lVar24 <= lVar26 && (iVar31.micros % 86400000000 < lVar9 % 86400000000)))))))) {
      pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_b0._M_unused._M_object = &local_a0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Invalid RANGE PRECEDING value","");
      OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
      __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar31 = WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,order_begin);
    lVar24 = (iVar31._0_8_ >> 0x20) + iVar31.micros / 86400000000;
    lVar26 = lVar24 % 0x1e;
    lVar27 = (long)iVar31.months + lVar24 / 0x1e;
    lVar25 = (local_48 >> 0x20) + lVar9 / 86400000000;
    lVar24 = lVar25 % 0x1e;
    lVar25 = (long)(int)local_48 + lVar25 / 0x1e;
    if ((lVar25 < lVar27) ||
       ((iVar23 = local_90, lVar25 <= lVar27 &&
        ((lVar24 < lVar26 ||
         ((lVar24 <= lVar26 && (lVar9 % 86400000000 < iVar31.micros % 86400000000)))))))) {
      pOVar19 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_b0._M_unused._M_object = &local_a0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Invalid RANGE FOLLOWING value","");
      OutOfRangeException::OutOfRangeException(pOVar19,(string *)&local_b0);
      __cxa_throw(pOVar19,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  uVar8 = prev->start;
  uVar21 = prev->end;
  if (uVar8 < uVar21) {
    if (uVar8 < iVar23 && order_begin <= uVar8) {
      WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,uVar8);
      uVar21 = prev->end;
    }
    if (uVar21 < iVar23 && order_begin < uVar21) {
      iVar31 = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,uVar21 - 1);
      lVar24 = (local_48 >> 0x20) + lVar9 / 86400000000;
      lVar26 = lVar24 % 0x1e;
      lVar28 = (long)(int)local_48 + lVar24 / 0x1e;
      lVar24 = iVar31.micros / 86400000000;
      local_50 = local_50 * lVar24;
      lVar24 = (iVar31._0_8_ >> 0x20) + lVar24;
      lVar27 = local_50 + iVar31.micros;
      lVar25 = lVar24 % 0x1e;
      lVar24 = (long)iVar31.months + lVar24 / 0x1e;
      if (lVar28 <= lVar24) {
        if (lVar24 <= lVar28) {
          if ((lVar25 < lVar26) || ((lVar25 <= lVar26 && (lVar27 < lVar9 % 86400000000))))
          goto LAB_017a3c10;
          if ((lVar25 <= lVar26) && (lVar27 <= lVar9 % 86400000000)) {
            iVar23 = prev->end;
            goto LAB_017a3c56;
          }
        }
        iVar23 = prev->end + 1;
      }
    }
  }
LAB_017a3c10:
  ::std::function<bool_(duckdb::interval_t,_duckdb::interval_t)>::function
            ((function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_b0,
             (function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_88);
  WVar44.pos = order_begin;
  WVar44.coll = range_lo;
  __last_11.pos = iVar23;
  __last_11.coll = range_hi;
  WVar44 = ::std::
           upper_bound<duckdb::WindowColumnIterator<duckdb::interval_t>,duckdb::interval_t,duckdb::OperationCompare<duckdb::interval_t,duckdb::LessThan>>
                     (WVar44,__last_11,&local_68,
                      (OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)&local_b0);
  iVar23 = WVar44.pos;
  if ((code *)local_a0._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_a0._M_allocated_capacity)(&local_b0,&local_b0,3);
  }
LAB_017a3c56:
  if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
    return iVar23;
  }
  (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
  return iVar23;
}

Assistant:

static idx_t FindRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                            const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                            const idx_t chunk_idx, const FrameBounds &prev) {
	switch (boundary.InternalType()) {
	case PhysicalType::INT8:
		return FindTypedRangeBound<int8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INT16:
		return FindTypedRangeBound<int16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT32:
		return FindTypedRangeBound<int32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT64:
		return FindTypedRangeBound<int64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT8:
		return FindTypedRangeBound<uint8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT16:
		return FindTypedRangeBound<uint16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT32:
		return FindTypedRangeBound<uint32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT64:
		return FindTypedRangeBound<uint64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::INT128:
		return FindTypedRangeBound<hugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                chunk_idx, prev);
	case PhysicalType::UINT128:
		return FindTypedRangeBound<uhugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	case PhysicalType::FLOAT:
		return FindTypedRangeBound<float, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                            chunk_idx, prev);
	case PhysicalType::DOUBLE:
		return FindTypedRangeBound<double, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INTERVAL:
		return FindTypedRangeBound<interval_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	default:
		throw InternalException("Unsupported column type for RANGE");
	}
}